

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O2

string * Bipartition::toStringVerbose
                   (string *__return_storage_ptr__,
                   dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *edge,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *leaf2NumMap)

{
  string *psVar1;
  long lVar2;
  size_type pos;
  reference rVar3;
  allocator local_79;
  string *local_78;
  string toDisplay;
  string local_50;
  
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&toDisplay,"",&local_79);
  pos = edge->m_num_bits;
  while (pos = pos - 1, pos != 0xffffffffffffffff) {
    rVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (edge,pos);
    if ((*rVar3.m_block & rVar3.m_mask) != 0) {
      std::__cxx11::string::append((string *)&toDisplay);
      std::__cxx11::string::append((char *)&toDisplay);
    }
  }
  std::__cxx11::string::string((string *)&local_50,(string *)&toDisplay);
  lVar2 = std::__cxx11::string::find_last_not_of((char)&toDisplay,0x2c);
  psVar1 = local_78;
  Tools::substring(local_78,&local_50,0,lVar2 + 1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&toDisplay);
  return psVar1;
}

Assistant:

string Bipartition::toStringVerbose(boost::dynamic_bitset<> edge, vector<string> leaf2NumMap) {
    string toDisplay = "";
    size_t edge_size = edge.size();
    for (size_t i = 0; i < edge_size; i++) {
        if ((bool)edge[edge_size - i - 1]) {
            toDisplay += leaf2NumMap[i];
            toDisplay += ",";
        }
    }
    // remove the last ,
    return Tools::substring(toDisplay, 0, toDisplay.find_last_not_of(',')+1);
}